

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.hpp
# Opt level: O2

index_t type_safe::operator+(index_t *lhs,difference_t *rhs)

{
  ulong uVar1;
  ulong uVar2;
  char *local_10;
  undefined4 local_8;
  
  uVar1 = (lhs->
          super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
          ).value_.value_;
  if ((long)uVar1 < 0) {
    local_10 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
    ;
    local_8 = 0x167;
    debug_assert::detail::
    do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[26]>
              (debug_assert::detail::always_false,&local_10,"","conversion would overflow");
  }
  else {
    uVar2 = (rhs->
            super_strong_typedef<type_safe::difference_t,_type_safe::integer<long,_type_safe::undefined_behavior_arithmetic>_>
            ).value_.value_;
    if (uVar1 <= (uVar2 ^ 0x7fffffffffffffff) || (long)uVar2 < 1) {
      if (-1 < (long)(uVar2 + uVar1)) {
        return (index_t)(uVar2 + uVar1);
      }
      goto LAB_0016cad5;
    }
  }
  local_10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/arithmetic_policy.hpp"
  ;
  local_8 = 0x91;
  debug_assert::detail::
  do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[33]>
            (debug_assert::detail::always_false,&local_10,"","addition will result in overflow");
LAB_0016cad5:
  local_10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
  ;
  local_8 = 0x186;
  debug_assert::detail::
  do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[27]>
            (debug_assert::detail::always_false,&local_10,"","conversion would underflow");
}

Assistant:

constexpr index_t operator+(const index_t& lhs, const difference_t& rhs) noexcept
{
    return index_t(make_unsigned(make_signed(get(lhs)) + get(rhs)));
}